

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-command.c
# Opt level: O2

void textui_cmd_retire(void)

{
  _Bool _Var1;
  keypress kVar2;
  
  event_signal(EVENT_INPUT_FLUSH);
  if (player->total_winner == 0) {
    _Var1 = get_check("Do you really want to retire?");
    if (_Var1) {
      prt("Please verify RETIRING THIS CHARACTER by typing the \'@\' sign: ",L'\0',L'\0');
      event_signal(EVENT_INPUT_FLUSH);
      kVar2 = inkey();
      prt("",L'\0',L'\0');
      if (kVar2.code == 0x40) goto LAB_001b182e;
    }
  }
  else {
    _Var1 = get_check("Do you want to retire? ");
    if (_Var1) {
LAB_001b182e:
      cmdq_push(CMD_RETIRE);
      return;
    }
  }
  return;
}

Assistant:

void textui_cmd_retire(void)
{
	/* Flush input */
	event_signal(EVENT_INPUT_FLUSH);

	/* Verify */
	if (player->total_winner) {
		if (!get_check("Do you want to retire? "))
			return;
	} else {
		struct keypress ch;

		if (!get_check("Do you really want to retire?"))
			return;

		/* Special Verification for retirement */
		prt("Please verify RETIRING THIS CHARACTER by typing the '@' sign: ", 0, 0);
		event_signal(EVENT_INPUT_FLUSH);
		ch = inkey();
		prt("", 0, 0);
		if (ch.code != '@') return;
	}

	cmdq_push(CMD_RETIRE);
}